

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void __thiscall
trompeloeil::call_matcher<bool(int),std::tuple<int>>::call_matcher<int_const&>
          (call_matcher<bool(int),std::tuple<int>> *this,char *file,unsigned_long line,
          char *call_string,int *u)

{
  undefined8 *puVar1;
  
  *(call_matcher<bool(int),std::tuple<int>> **)(this + 8) = this;
  *(call_matcher<bool(int),std::tuple<int>> **)(this + 0x10) = this;
  *(char **)(this + 0x18) = file;
  *(unsigned_long *)(this + 0x20) = line;
  *(char **)(this + 0x28) = call_string;
  *(undefined ***)this = &PTR__call_matcher_004f1b10;
  *(undefined **)(this + 0x30) = &DAT_004f1b78;
  *(call_matcher<bool(int),std::tuple<int>> **)(this + 0x40) = this + 0x38;
  *(call_matcher<bool(int),std::tuple<int>> **)(this + 0x48) = this + 0x38;
  *(undefined ***)(this + 0x38) = &PTR__list_004f1bf8;
  *(call_matcher<bool(int),std::tuple<int>> **)(this + 0x58) = this + 0x50;
  *(call_matcher<bool(int),std::tuple<int>> **)(this + 0x60) = this + 0x50;
  *(undefined ***)(this + 0x50) = &PTR__list_004f1c80;
  *(undefined8 *)(this + 0x68) = 0;
  puVar1 = (undefined8 *)operator_new(0x38);
  puVar1[1] = 1;
  puVar1[2] = 1;
  puVar1[3] = 0;
  *puVar1 = &PTR__sequence_handler_004f0348;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  *(undefined8 **)(this + 0x70) = puVar1;
  *(int *)(this + 0x78) = *u;
  this[0x7c] = (call_matcher<bool(int),std::tuple<int>>)0x0;
  return;
}

Assistant:

call_matcher(
      char const *file,
      unsigned long line,
      char const *call_string,
      U &&... u)
    : call_matcher_base<Sig>(location{file, line}, call_string)
    , val(std::forward<U>(u)...)
    {}